

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

SampleAnalysis * Catch::Benchmark::Detail::analyse(IConfig *cfg,FDuration *first,FDuration *last)

{
  Estimate<double> e;
  Estimate<double> e_00;
  bool bVar1;
  ulong uVar2;
  reference pdVar3;
  duration<double,_std::ratio<1L,_1000000000L>_> *in_RCX;
  duration<double,_std::ratio<1L,_1000000000L>_> *in_RDX;
  long *in_RSI;
  SampleAnalysis *in_RDI;
  FDuration *it;
  int i;
  FDuration mean;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  samples_1;
  double s;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  samples2;
  anon_class_1_0_00000001 wrap_estimate;
  OutlierClassification outliers;
  bootstrap_analysis analysis;
  FDuration *current;
  vector<double,_std::allocator<double>_> samples;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde0;
  value_type *in_stack_fffffffffffffde8;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe00;
  Estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *this;
  size_type in_stack_fffffffffffffe08;
  undefined1 *puVar4;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe10;
  SampleAnalysis *pSVar5;
  int local_17c [3];
  double local_170;
  duration<double,_std::ratio<1L,_1000000000L>_> *local_168;
  int local_15c;
  duration<double,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffea8;
  double *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffee8;
  double *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  uint n_resamples;
  double in_stack_ffffffffffffff00;
  duration<double,std::ratio<1l,1000000000l>> local_f8 [8];
  double local_f0;
  double *local_e8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_e0;
  vector<double,_std::allocator<double>_> *local_d8;
  undefined1 local_d0 [28];
  undefined8 local_b4;
  undefined8 local_ac;
  int local_a4;
  anon_class_1_0_00000001 *paStack_88;
  anon_class_1_0_00000001 *paStack_68;
  double local_60;
  rep local_58;
  duration<double,_std::ratio<1L,_1000000000L>_> *local_50;
  vector<double,_std::allocator<double>_> local_38;
  duration<double,_std::ratio<1L,_1000000000L>_> *local_20;
  duration<double,_std::ratio<1L,_1000000000L>_> *local_18;
  long *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = (**(code **)(*in_RSI + 0xc0))();
  if ((uVar2 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x174158);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    for (local_50 = local_18; n_resamples = (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20),
        local_50 != local_20; local_50 = local_50 + 1) {
      local_58 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count(local_50);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffde0,(value_type_conflict4 *)in_stack_fffffffffffffdd8);
    }
    (**(code **)(*local_10 + 0xd0))();
    (**(code **)(*local_10 + 0xd8))();
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x17425d);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x17426c);
    std::vector<double,_std::allocator<double>_>::size(&local_38);
    analyse_samples(in_stack_ffffffffffffff00,n_resamples,in_stack_fffffffffffffef0,
                    in_stack_fffffffffffffee8);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x1742ba);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x1742c9);
    std::vector<double,_std::allocator<double>_>::size(&local_38);
    classify_outliers(in_stack_fffffffffffffeb0,(double *)in_stack_fffffffffffffea8.__r);
    puVar4 = local_d0;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)0x17430a);
    std::vector<double,_std::allocator<double>_>::size(&local_38);
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_d8 = &local_38;
    local_e0._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdd8);
    local_e8 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffdd8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_fffffffffffffde0,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_fffffffffffffdd8);
      if (!bVar1) break;
      pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_e0);
      local_f0 = *pdVar3;
      std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<double,void>
                (local_f8,&local_f0);
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ::push_back((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                   *)in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_e0);
    }
    pSVar5 = in_RDI;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)in_stack_fffffffffffffde0,
             (vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)in_stack_fffffffffffffdd8);
    e.lower_bound = (double)in_stack_fffffffffffffe08;
    e.point = (double)in_stack_fffffffffffffe00;
    e.upper_bound = (double)pSVar5;
    e.confidence_interval = (double)puVar4;
    analyse::anon_class_1_0_00000001::operator()(paStack_88,e);
    e_00.lower_bound = (double)in_stack_fffffffffffffe08;
    e_00.point = (double)in_stack_fffffffffffffe00;
    e_00.upper_bound = (double)pSVar5;
    e_00.confidence_interval = (double)puVar4;
    analyse::anon_class_1_0_00000001::operator()(paStack_68,e_00);
    (in_RDI->outliers).samples_seen = (undefined4)local_b4;
    (in_RDI->outliers).low_severe = local_b4._4_4_;
    (in_RDI->outliers).low_mild = (undefined4)local_ac;
    (in_RDI->outliers).high_mild = local_ac._4_4_;
    (in_RDI->outliers).high_severe = local_a4;
    in_RDI->outlier_variance = local_60;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::~vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)paStack_68);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)paStack_68);
  }
  else {
    puVar4 = &stack0xfffffffffffffeb0;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)0x17455a);
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)in_stack_fffffffffffffe10,(size_type)puVar4);
    memset(&stack0xfffffffffffffea8,0,8);
    local_15c = 0;
    for (local_168 = local_18; local_168 < local_20; local_168 = local_168 + 1) {
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ::push_back(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::operator+=
                ((duration<double,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffde0,
                 (duration<double,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffdd8);
      local_15c = local_15c + 1;
    }
    local_170 = (double)local_15c;
    std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::operator/=
              ((duration<double,_std::ratio<1L,_1000000000L>_> *)&stack0xfffffffffffffea8,&local_170
              );
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)in_stack_fffffffffffffde0,
             (vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)in_stack_fffffffffffffdd8);
    (in_RDI->mean).point.__r = in_stack_fffffffffffffea8.__r;
    (in_RDI->mean).lower_bound.__r = in_stack_fffffffffffffea8.__r;
    (in_RDI->mean).upper_bound.__r = in_stack_fffffffffffffea8.__r;
    (in_RDI->mean).confidence_interval = 0.0;
    this = &in_RDI->standard_deviation;
    local_17c[2] = 0;
    std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<double,std::ratio<1l,1000000000l>> *)this,local_17c + 2);
    local_17c[1] = 0;
    std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<double,std::ratio<1l,1000000000l>> *)&this->lower_bound,local_17c + 1);
    local_17c[0] = 0;
    std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<double,std::ratio<1l,1000000000l>> *)&this->upper_bound,local_17c);
    this->confidence_interval = 0.0;
    (in_RDI->outliers).samples_seen = 0;
    (in_RDI->outliers).low_severe = 0;
    (in_RDI->outliers).low_mild = 0;
    (in_RDI->outliers).high_mild = 0;
    (in_RDI->outliers).high_severe = 0;
    in_RDI->outlier_variance = 0.0;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::~vector(in_stack_fffffffffffffdf0);
  }
  return in_RDI;
}

Assistant:

SampleAnalysis analyse(const IConfig &cfg, FDuration* first, FDuration* last) {
                if (!cfg.benchmarkNoAnalysis()) {
                    std::vector<double> samples;
                    samples.reserve(static_cast<size_t>(last - first));
                    for (auto current = first; current != last; ++current) {
                        samples.push_back( current->count() );
                    }

                    auto analysis = Catch::Benchmark::Detail::analyse_samples(
                        cfg.benchmarkConfidenceInterval(),
                        cfg.benchmarkResamples(),
                        samples.data(),
                        samples.data() + samples.size() );
                    auto outliers = Catch::Benchmark::Detail::classify_outliers(
                        samples.data(), samples.data() + samples.size() );

                    auto wrap_estimate = [](Estimate<double> e) {
                        return Estimate<FDuration> {
                            FDuration(e.point),
                                FDuration(e.lower_bound),
                                FDuration(e.upper_bound),
                                e.confidence_interval,
                        };
                    };
                    std::vector<FDuration> samples2;
                    samples2.reserve(samples.size());
                    for (auto s : samples) {
                        samples2.push_back( FDuration( s ) );
                    }

                    return {
                        CATCH_MOVE(samples2),
                        wrap_estimate(analysis.mean),
                        wrap_estimate(analysis.standard_deviation),
                        outliers,
                        analysis.outlier_variance,
                    };
                } else {
                    std::vector<FDuration> samples;
                    samples.reserve(static_cast<size_t>(last - first));

                    FDuration mean = FDuration(0);
                    int i = 0;
                    for (auto it = first; it < last; ++it, ++i) {
                        samples.push_back(*it);
                        mean += *it;
                    }
                    mean /= i;

                    return SampleAnalysis{
                        CATCH_MOVE(samples),
                        Estimate<FDuration>{ mean, mean, mean, 0.0 },
                        Estimate<FDuration>{ FDuration( 0 ),
                                             FDuration( 0 ),
                                             FDuration( 0 ),
                                             0.0 },
                        OutlierClassification{},
                        0.0
                    };
                }
            }